

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O0

Maybe<capnp::compiler::Module_&> __thiscall
capnp::compiler::ModuleLoader::Impl::loadModuleFromSearchPath(Impl *this,PathPtr path)

{
  Vector<const_kj::ReadableDirectory_*> *dir;
  PathPtr path_00;
  Module *module;
  undefined1 local_58 [16];
  Module *_module262;
  ReadableDirectory *candidate;
  ReadableDirectory **__end2;
  ReadableDirectory **__begin2;
  Vector<const_kj::ReadableDirectory_*> *__range2;
  Impl *this_local;
  PathPtr path_local;
  
  this_local = (Impl *)path.parts.size_;
  dir = (Vector<const_kj::ReadableDirectory_*> *)path.parts.ptr;
  __begin2 = (ReadableDirectory **)&(dir->builder).pos;
  __range2 = dir;
  path_local.parts.size_ = (size_t)this;
  __end2 = kj::Vector<const_kj::ReadableDirectory_*>::begin
                     ((Vector<const_kj::ReadableDirectory_*> *)__begin2);
  candidate = (ReadableDirectory *)
              kj::Vector<const_kj::ReadableDirectory_*>::end
                        ((Vector<const_kj::ReadableDirectory_*> *)__begin2);
  while( true ) {
    if ((ReadableDirectory *)__end2 == candidate) {
      kj::Maybe<capnp::compiler::Module_&>::Maybe((Maybe<capnp::compiler::Module_&> *)this);
      return (Maybe<capnp::compiler::Module_&>)(Module *)this;
    }
    _module262 = (Module *)*__end2;
    path_00.parts.size_ = (size_t)this_local;
    path_00.parts.ptr = (String *)_module262;
    loadModule((Impl *)local_58,(ReadableDirectory *)dir,path_00);
    local_58._8_8_ =
         kj::_::readMaybe<capnp::compiler::Module>((Maybe<capnp::compiler::Module_&> *)local_58);
    if ((Module *)local_58._8_8_ != (Module *)0x0) break;
    __end2 = __end2 + 1;
    local_58._8_8_ = (ReadableDirectory **)0x0;
  }
  kj::Maybe<capnp::compiler::Module_&>::Maybe
            ((Maybe<capnp::compiler::Module_&> *)this,(Module *)local_58._8_8_);
  return (Maybe<capnp::compiler::Module_&>)(Module *)this;
}

Assistant:

kj::Maybe<Module&> ModuleLoader::Impl::loadModuleFromSearchPath(kj::PathPtr path) {
  for (auto candidate: searchPath) {
    KJ_IF_SOME(module, loadModule(*candidate, path)) {
      return module;
    }
  }
  return kj::none;
}